

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int amqpvalue_get_accepted(AMQP_VALUE value,ACCEPTED_HANDLE *accepted_handle)

{
  int iVar1;
  AMQP_VALUE pAVar2;
  uint32_t local_34;
  AMQP_VALUE pAStack_30;
  uint32_t list_item_count;
  AMQP_VALUE list_value;
  ACCEPTED_INSTANCE *accepted_instance;
  ACCEPTED_HANDLE *ppAStack_18;
  int result;
  ACCEPTED_HANDLE *accepted_handle_local;
  AMQP_VALUE value_local;
  
  ppAStack_18 = accepted_handle;
  accepted_handle_local = (ACCEPTED_HANDLE *)value;
  list_value = (AMQP_VALUE)accepted_create_internal();
  *ppAStack_18 = (ACCEPTED_HANDLE)list_value;
  if (*ppAStack_18 == (ACCEPTED_HANDLE)0x0) {
    accepted_instance._4_4_ = 0x44d5;
  }
  else {
    pAStack_30 = amqpvalue_get_inplace_described_value((AMQP_VALUE)accepted_handle_local);
    if (pAStack_30 == (AMQP_VALUE)0x0) {
      accepted_destroy(*ppAStack_18);
      accepted_instance._4_4_ = 0x44dd;
    }
    else {
      iVar1 = amqpvalue_get_list_item_count(pAStack_30,&local_34);
      if (iVar1 == 0) {
        pAVar2 = amqpvalue_clone((AMQP_VALUE)accepted_handle_local);
        *(AMQP_VALUE *)list_value = pAVar2;
        accepted_instance._4_4_ = 0;
      }
      else {
        accepted_instance._4_4_ = 0x44e4;
      }
    }
  }
  return accepted_instance._4_4_;
}

Assistant:

int amqpvalue_get_accepted(AMQP_VALUE value, ACCEPTED_HANDLE* accepted_handle)
{
    int result;
    ACCEPTED_INSTANCE* accepted_instance = (ACCEPTED_INSTANCE*)accepted_create_internal();
    *accepted_handle = accepted_instance;
    if (*accepted_handle == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        AMQP_VALUE list_value = amqpvalue_get_inplace_described_value(value);
        if (list_value == NULL)
        {
            accepted_destroy(*accepted_handle);
            result = MU_FAILURE;
        }
        else
        {
            uint32_t list_item_count;
            if (amqpvalue_get_list_item_count(list_value, &list_item_count) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                do
                {

                    accepted_instance->composite_value = amqpvalue_clone(value);

                    result = 0;
                } while(0);
            }
        }
    }

    return result;
}